

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::allocateStrings(UnicodeSet *this,UErrorCode *status)

{
  UBool UVar1;
  UVector *this_00;
  UErrorCode *size;
  UVector *local_50;
  UErrorCode *status_local;
  UnicodeSet *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    local_50 = (UVector *)0x0;
    if (this_00 != (UVector *)0x0) {
      UVector::UVector(this_00,uprv_deleteUObject_63,uhash_compareUnicodeString_63,1,status);
      local_50 = this_00;
    }
    this->strings = local_50;
    if (this->strings == (UVector *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      this_local._7_1_ = '\0';
    }
    else {
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        this_local._7_1_ = '\x01';
      }
      else {
        if (this->strings != (UVector *)0x0) {
          (*(this->strings->super_UObject)._vptr_UObject[1])();
        }
        this->strings = (UVector *)0x0;
        this_local._7_1_ = '\0';
      }
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool UnicodeSet::allocateStrings(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    strings = new UVector(uprv_deleteUObject,
                          uhash_compareUnicodeString, 1, status);
    if (strings == NULL) { // Check for memory allocation error.
        status = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    if (U_FAILURE(status)) {
        delete strings;
        strings = NULL;
        return FALSE;
    } 
    return TRUE;
}